

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkMultiplierCharacter(string *unit_string,uint64_t match_flags,char mchar)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined1 *puVar5;
  precise_unit pVar6;
  string local_e8;
  double local_c8;
  double dStack_c0;
  undefined4 local_b4;
  string local_b0;
  double local_90;
  double dStack_88;
  ulong local_70;
  size_type fd;
  precise_unit retunit;
  undefined1 local_50 [8];
  string ustring;
  char mchar_local;
  uint64_t match_flags_local;
  string *unit_string_local;
  double local_10;
  
  ustring.field_2._M_local_buf[0xf] = mchar;
  std::__cxx11::string::string((string *)local_50);
  precise_unit::precise_unit((precise_unit *)&fd);
  local_70 = std::__cxx11::string::find_first_of
                       ((char)unit_string,(ulong)(uint)(int)ustring.field_2._M_local_buf[0xf]);
  if (local_70 != 0xffffffffffffffff) {
    lVar3 = std::__cxx11::string::find_first_of
                      ((char)unit_string,(ulong)(uint)(int)ustring.field_2._M_local_buf[0xf]);
    if (lVar3 == -1) {
      std::__cxx11::string::operator=((string *)local_50,(string *)unit_string);
      std::__cxx11::string::erase((ulong)local_50,local_70);
      std::__cxx11::string::string((string *)&local_b0,(string *)local_50);
      pVar6 = unit_quick_match(&local_b0,match_flags);
      dStack_88 = pVar6._8_8_;
      local_90 = pVar6.multiplier_;
      fd = (size_type)local_90;
      retunit.multiplier_ = dStack_88;
      std::__cxx11::string::~string((string *)&local_b0);
      bVar2 = is_error((precise_unit *)&fd);
      if (!bVar2) {
        unit_string_local = (string *)fd;
        local_10 = retunit.multiplier_;
        goto LAB_001e41fa;
      }
    }
    std::__cxx11::string::operator=((string *)local_50,(string *)unit_string);
    while (uVar1 = local_70, local_70 != 0xffffffffffffffff) {
      lVar3 = std::__cxx11::string::size();
      if (uVar1 == lVar3 - 1U) {
        std::__cxx11::string::erase((ulong)local_50,local_70);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
        bVar2 = isDigitCharacter(*pcVar4);
        if (bVar2) {
          if ((local_70 != 0) &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50), *pcVar4 != '^')) {
            std::__cxx11::string::insert((ulong)local_50,local_70,'\x01');
            local_70 = local_70 + 1;
          }
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
          if (*pcVar4 == ustring.field_2._M_local_buf[0xf]) {
            unit_string_local = (string *)0x7ff4000000000000;
            local_10 = 2.07707442941207e-314;
            goto LAB_001e41fa;
          }
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
          if ((*pcVar4 != '[') &&
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50), *pcVar4 != '(')) {
            puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_50);
            *puVar5 = 0x2a;
          }
        }
      }
      local_70 = std::__cxx11::string::find_first_of
                           ((char)local_50,(ulong)(uint)(int)ustring.field_2._M_local_buf[0xf]);
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,unit_string);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_e8,(string *)local_50);
      pVar6 = unit_from_string_internal(&local_e8,match_flags | 0x400000000);
      dStack_c0 = pVar6._8_8_;
      local_c8 = pVar6.multiplier_;
      fd = (size_type)local_c8;
      retunit.multiplier_ = dStack_c0;
      std::__cxx11::string::~string((string *)&local_e8);
      bVar2 = is_error((precise_unit *)&fd);
      if (!bVar2) {
        unit_string_local = (string *)fd;
        local_10 = retunit.multiplier_;
        goto LAB_001e41fa;
      }
    }
  }
  unit_string_local = (string *)0x7ff4000000000000;
  local_10 = 2.07707442941207e-314;
LAB_001e41fa:
  local_b4 = 1;
  std::__cxx11::string::~string((string *)local_50);
  pVar6._8_8_ = local_10;
  pVar6.multiplier_ = (double)unit_string_local;
  return pVar6;
}

Assistant:

static precise_unit checkMultiplierCharacter(
    const std::string& unit_string,
    std::uint64_t match_flags,
    char mchar)
{
    // assume mchar means multiply
    std::string ustring;
    precise_unit retunit;
    auto fd = unit_string.find_first_of(mchar);
    if (fd != std::string::npos) {
        // if there is a single one just check for a merged unit
        if (unit_string.find_first_of(mchar, fd + 1) == std::string::npos) {
            ustring = unit_string;
            ustring.erase(fd, 1);
            retunit = unit_quick_match(ustring, match_flags);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
        ustring = unit_string;
        while (fd != std::string::npos) {
            if (fd == ustring.size() - 1) {
                ustring.erase(fd, 1);
            } else if (isDigitCharacter(ustring[fd + 1])) {
                if (fd > 0 && ustring[fd - 1] != '^') {
                    ustring.insert(fd, 1, '^');
                    fd += 1;
                }
            } else if (ustring[fd + 1] == mchar) {
                // repeated characters,  cannot mean separator
                return precise::invalid;
            } else if (ustring[fd + 1] != '[' && ustring[fd + 1] != '(') {
                ustring[fd] = '*';
            }
            // ignore adjacent ones
            fd = ustring.find_first_of(mchar, fd + 2);
        }
        if (ustring != unit_string) {
            retunit = unit_from_string_internal(
                ustring, match_flags | skip_partition_check);
            if (!is_error(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}